

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
OpenMD::PotentialEnergyObjectiveFunction::setInitialCoords(PotentialEnergyObjectiveFunction *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  reference pvVar5;
  double *pdVar6;
  reference pvVar7;
  long in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  int index;
  int iproc_1;
  int iproc;
  Vector3d eulerAngle;
  Vector3d pos;
  Atom *atom;
  StuntDouble *sd;
  Molecule *mol;
  AtomIterator ai;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  vector<int,_std::allocator<int>_> onProc;
  DynamicVector<double,_std::allocator<double>_> *xinit;
  allocator_type *alloc;
  StuntDouble *in_stack_fffffffffffffd80;
  StuntDouble *in_stack_fffffffffffffd88;
  Atom *in_stack_fffffffffffffd90;
  iterator *in_stack_fffffffffffffd98;
  SimInfo *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdb0;
  int local_a8;
  int local_a4;
  Vector<double,_3U> local_a0;
  Vector<double,_3U> local_88;
  Atom *local_70;
  StuntDouble *local_68;
  Molecule *local_60;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_58;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_50;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_48;
  undefined4 local_40;
  undefined4 local_2c;
  vector<int,_std::allocator<int>_> local_28;
  
  MPI_Comm_size(&ompi_mpi_comm_world,in_RSI + 0x38);
  MPI_Comm_rank(&ompi_mpi_comm_world,in_RSI + 0x3c);
  local_2c = 0;
  std::allocator<int>::allocator((allocator<int> *)0x19ab5f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda0,
             (size_type)in_stack_fffffffffffffd98,(value_type_conflict2 *)in_stack_fffffffffffffd90,
             (allocator_type *)in_stack_fffffffffffffd88);
  std::allocator<int>::~allocator((allocator<int> *)0x19ab93);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x19abac);
  local_40 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (value_type_conflict2 *)in_stack_fffffffffffffda0);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_58);
  Vector3<double>::Vector3((Vector3<double> *)0x19ac0e);
  Vector3<double>::Vector3((Vector3<double> *)0x19ac1d);
  *(undefined4 *)(in_RSI + 0x34) = 0;
  local_60 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
  while (local_60 != (Molecule *)0x0) {
    local_68 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffda0,
                          (iterator *)in_stack_fffffffffffffd98);
    while (local_68 != (StuntDouble *)0x0) {
      *(int *)(in_RSI + 0x34) = *(int *)(in_RSI + 0x34) + 3;
      bVar4 = StuntDouble::isDirectional(in_stack_fffffffffffffd80);
      if (bVar4) {
        *(int *)(in_RSI + 0x34) = *(int *)(in_RSI + 0x34) + 3;
      }
      local_68 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffda0,
                            (iterator *)in_stack_fffffffffffffd98);
    }
    local_60 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
  }
  if ((*(byte *)(in_RSI + 0x30) & 1) != 0) {
    local_60 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
    while (local_60 != (Molecule *)0x0) {
      local_70 = Molecule::beginFluctuatingCharge
                           ((Molecule *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      while (local_70 != (Atom *)0x0) {
        *(int *)(in_RSI + 0x34) = *(int *)(in_RSI + 0x34) + 1;
        local_70 = Molecule::nextFluctuatingCharge
                             ((Molecule *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
      local_60 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98)
      ;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
  alloc = (allocator_type *)&ompi_mpi_comm_world;
  MPI_Allgather(in_RSI + 0x34,1,&ompi_mpi_int,pvVar5);
  *(undefined4 *)(in_RSI + 0x34) = 0;
  for (local_a4 = 0; local_a4 < *(int *)(in_RSI + 0x38); local_a4 = local_a4 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_a4);
    *(value_type *)(in_RSI + 0x34) = *pvVar5 + *(int *)(in_RSI + 0x34);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),0);
  *pvVar5 = 0;
  for (local_a8 = 1; local_a8 < *(int *)(in_RSI + 0x38); local_a8 = local_a8 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),(long)(local_a8 + -1));
    iVar2 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)(local_a8 + -1));
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),(long)local_a8);
    *pvVar5 = iVar2 + iVar3;
  }
  std::allocator<double>::allocator((allocator<double> *)0x19b06f);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd90,
             (size_type)in_stack_fffffffffffffd88,(value_type_conflict1 *)in_stack_fffffffffffffd80,
             alloc);
  std::allocator<double>::~allocator((allocator<double> *)0x19b0a3);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),(long)*(int *)(in_RSI + 0x3c));
  local_60 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
  while (local_60 != (Molecule *)0x0) {
    local_68 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffda0,
                          (iterator *)in_stack_fffffffffffffd98);
    while (local_68 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffd88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd80,(Vector3<double> *)alloc);
      pdVar6 = Vector<double,_3U>::operator[](&local_88,0);
      dVar1 = *pdVar6;
      pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                         ((DynamicVector<double,_std::allocator<double>_> *)
                          in_stack_fffffffffffffd80,(size_type)alloc);
      *pvVar7 = dVar1;
      pdVar6 = Vector<double,_3U>::operator[](&local_88,1);
      dVar1 = *pdVar6;
      pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                         ((DynamicVector<double,_std::allocator<double>_> *)
                          in_stack_fffffffffffffd80,(size_type)alloc);
      *pvVar7 = dVar1;
      pdVar6 = Vector<double,_3U>::operator[](&local_88,2);
      dVar1 = *pdVar6;
      pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                         ((DynamicVector<double,_std::allocator<double>_> *)
                          in_stack_fffffffffffffd80,(size_type)alloc);
      *pvVar7 = dVar1;
      bVar4 = StuntDouble::isDirectional(in_stack_fffffffffffffd80);
      if (bVar4) {
        StuntDouble::getEuler(in_stack_fffffffffffffd88);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffd80,(Vector3<double> *)alloc);
        pdVar6 = Vector<double,_3U>::operator[](&local_a0,0);
        dVar1 = *pdVar6;
        pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                           ((DynamicVector<double,_std::allocator<double>_> *)
                            in_stack_fffffffffffffd80,(size_type)alloc);
        *pvVar7 = dVar1;
        pdVar6 = Vector<double,_3U>::operator[](&local_a0,1);
        dVar1 = *pdVar6;
        pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                           ((DynamicVector<double,_std::allocator<double>_> *)
                            in_stack_fffffffffffffd80,(size_type)alloc);
        *pvVar7 = dVar1;
        pdVar6 = Vector<double,_3U>::operator[](&local_a0,2);
        dVar1 = *pdVar6;
        pvVar7 = DynamicVector<double,_std::allocator<double>_>::operator[]
                           ((DynamicVector<double,_std::allocator<double>_> *)
                            in_stack_fffffffffffffd80,(size_type)alloc);
        *pvVar7 = dVar1;
      }
      local_68 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffda0,
                            (iterator *)in_stack_fffffffffffffd98);
    }
    local_60 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
  }
  if ((*(byte *)(in_RSI + 0x30) & 1) != 0) {
    local_60 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98);
    while (local_60 != (Molecule *)0x0) {
      local_70 = Molecule::beginFluctuatingCharge
                           ((Molecule *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      while (local_70 != (Atom *)0x0) {
        in_stack_fffffffffffffda0 = (SimInfo *)StuntDouble::getFlucQPos(in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd98 =
             (iterator *)
             DynamicVector<double,_std::allocator<double>_>::operator[]
                       ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd80,
                        (size_type)alloc);
        in_stack_fffffffffffffd98->_M_current = (Atom **)in_stack_fffffffffffffda0;
        in_stack_fffffffffffffd90 =
             Molecule::nextFluctuatingCharge
                       ((Molecule *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        local_70 = in_stack_fffffffffffffd90;
      }
      local_60 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffda0,(MoleculeIterator *)in_stack_fffffffffffffd98)
      ;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90);
  return in_RDI;
}

Assistant:

DynamicVector<RealType> PotentialEnergyObjectiveFunction::setInitialCoords() {
#ifdef IS_MPI
    MPI_Comm_size(MPI_COMM_WORLD, &nproc_);
    MPI_Comm_rank(MPI_COMM_WORLD, &myrank_);
    std::vector<int> onProc(nproc_, 0);

    displacements_.clear();
    displacements_.resize(nproc_, 0);
#endif

    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule::AtomIterator ai;
    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    Vector3d pos;
    Vector3d eulerAngle;

    ndf_ = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_ += 3;

        if (sd->isDirectional()) { ndf_ += 3; }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          ndf_++;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allgather(&ndf_, 1, MPI_INT, &onProc[0], 1, MPI_INT, MPI_COMM_WORLD);

    ndf_ = 0;
    for (int iproc = 0; iproc < nproc_; iproc++) {
      ndf_ += onProc[iproc];
    }

    displacements_[0] = 0;
    for (int iproc = 1; iproc < nproc_; iproc++) {
      displacements_[iproc] = displacements_[iproc - 1] + onProc[iproc - 1];
    }
#endif

    DynamicVector<RealType> xinit(ndf_, 0.0);

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos            = sd->getPos();
        xinit[index++] = pos[0];
        xinit[index++] = pos[1];
        xinit[index++] = pos[2];

        if (sd->isDirectional()) {
          eulerAngle     = sd->getEuler();
          xinit[index++] = eulerAngle[0];
          xinit[index++] = eulerAngle[1];
          xinit[index++] = eulerAngle[2];
        }
      }
    }

    if (hasFlucQ_) {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginFluctuatingCharge(ai); atom != NULL;
             atom = mol->nextFluctuatingCharge(ai)) {
          xinit[index++] = atom->getFlucQPos();
        }
      }
    }

    return xinit;
  }